

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::AddGenerators
          (MessageGenerator *this,
          vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          *enum_generators,
          vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
          *extension_generators)

{
  ExtensionGenerator *pEVar1;
  long lVar2;
  Descriptor *pDVar3;
  long lVar4;
  _Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false> local_38;
  
  lVar2 = 0;
  for (lVar4 = 0; pDVar3 = this->descriptor_, lVar4 < *(int *)(pDVar3 + 0x78); lVar4 = lVar4 + 1) {
    pEVar1 = (ExtensionGenerator *)operator_new(0x68);
    EnumGenerator::EnumGenerator
              ((EnumGenerator *)pEVar1,(EnumDescriptor *)(*(long *)(pDVar3 + 0x40) + lVar2),
               &this->variables_,&this->options_);
    local_38._M_head_impl = pEVar1;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
    ::emplace_back<google::protobuf::compiler::cpp::EnumGenerator*>
              ((vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
                *)enum_generators,(EnumGenerator **)&local_38);
    local_38._M_head_impl =
         (ExtensionGenerator *)
         (enum_generators->
         super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
         .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>.
         _M_head_impl;
    std::
    vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
    ::emplace_back<google::protobuf::compiler::cpp::EnumGenerator_const*>
              ((vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
                *)&this->enum_generators_,(EnumGenerator **)&local_38);
    lVar2 = lVar2 + 0x50;
  }
  lVar4 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(pDVar3 + 0x80); lVar2 = lVar2 + 1) {
    pEVar1 = (ExtensionGenerator *)operator_new(0xf8);
    ExtensionGenerator::ExtensionGenerator
              (pEVar1,(FieldDescriptor *)(*(long *)(pDVar3 + 0x50) + lVar4),&this->options_);
    local_38._M_head_impl = pEVar1;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
    ::emplace_back<google::protobuf::compiler::cpp::ExtensionGenerator*>
              ((vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
                *)extension_generators,&local_38._M_head_impl);
    local_38._M_head_impl =
         (extension_generators->
         super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
         .super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>.
         _M_head_impl;
    std::
    vector<google::protobuf::compiler::cpp::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_const*>>
    ::emplace_back<google::protobuf::compiler::cpp::ExtensionGenerator_const*>
              ((vector<google::protobuf::compiler::cpp::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_const*>>
                *)&this->extension_generators_,&local_38._M_head_impl);
    pDVar3 = this->descriptor_;
    lVar4 = lVar4 + 0x98;
  }
  return;
}

Assistant:

void MessageGenerator::AddGenerators(
    std::vector<std::unique_ptr<EnumGenerator>>* enum_generators,
    std::vector<std::unique_ptr<ExtensionGenerator>>* extension_generators) {
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators->emplace_back(
        new EnumGenerator(descriptor_->enum_type(i), variables_, options_));
    enum_generators_.push_back(enum_generators->back().get());
  }
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators->emplace_back(
        new ExtensionGenerator(descriptor_->extension(i), options_));
    extension_generators_.push_back(extension_generators->back().get());
  }
}